

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

void Abc_FrameMiniAigSetCoRequireds(Abc_Frame_t *pAbc,int *pRequireds)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Vec_Int_t *pVVar3;
  int *__dest;
  char *__s;
  
  if (pRequireds == (int *)0x0) {
    __s = "Required times are not given.";
  }
  else if (pAbc == (Abc_Frame_t *)0x0) {
    __s = "ABC framework is not initialized by calling Abc_Start().";
  }
  else {
    pGVar2 = Abc_FrameReadGia(pAbc);
    if (pGVar2 != (Gia_Man_t *)0x0) {
      pVVar3 = pGVar2->vCoReqs;
      if (pVVar3 != (Vec_Int_t *)0x0) {
        if (pVVar3->pArray != (int *)0x0) {
          free(pVVar3->pArray);
          pGVar2->vCoReqs->pArray = (int *)0x0;
          pVVar3 = pGVar2->vCoReqs;
          if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_0021489a;
        }
        free(pVVar3);
        pGVar2->vCoReqs = (Vec_Int_t *)0x0;
      }
LAB_0021489a:
      iVar1 = pGVar2->vCos->nSize;
      pVVar3 = (Vec_Int_t *)malloc(0x10);
      pVVar3->nSize = iVar1;
      pVVar3->nCap = iVar1;
      __dest = (int *)malloc((long)iVar1 << 2);
      pVVar3->pArray = __dest;
      memcpy(__dest,pRequireds,(long)iVar1 << 2);
      pGVar2->vCoReqs = pVVar3;
      return;
    }
    __s = "Current network in ABC framework is not defined.";
  }
  puts(__s);
  return;
}

Assistant:

void Abc_FrameMiniAigSetCoRequireds( Abc_Frame_t * pAbc, int * pRequireds )
{
    Gia_Man_t * pGia;
    if ( pRequireds == NULL )
        { printf( "Required times are not given.\n" ); return; }
    if ( pAbc == NULL )
        { printf( "ABC framework is not initialized by calling Abc_Start().\n" ); return; }
    pGia = Abc_FrameReadGia( pAbc );
    if ( pGia == NULL )
        { printf( "Current network in ABC framework is not defined.\n" ); return; }
    Vec_IntFreeP( &pGia->vCoReqs );
    pGia->vCoReqs = Vec_IntAllocArrayCopy( pRequireds, Gia_ManCoNum(pGia) );
}